

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O2

VTable * __thiscall
flatbuffers::BinaryAnnotator::GetOrBuildVTable
          (BinaryAnnotator *this,uint64_t vtable_offset,Object *table,
          uint64_t offset_of_referring_table)

{
  BinaryAnnotator *this_00;
  bool bVar1;
  ushort uVar2;
  Optional<unsigned_short> OVar3;
  _Optional_payload_base<unsigned_short> _Var4;
  _List_node_base *this_01;
  String *this_02;
  ulong uVar5;
  mapped_type *pmVar6;
  _Storage<unsigned_short,_true> _Var7;
  ulong uVar8;
  BinaryRegionComment *this_03;
  string *this_04;
  ulong offset;
  _List_node_base *p_Var9;
  VTable *pVVar10;
  uint64_t uVar11;
  iterator __end1;
  uint64_t uVar12;
  uint16_t vtable_size;
  uint16_t fields_processed;
  uint64_t vtable_offset_local;
  BinaryAnnotator *local_7c8;
  _Optional_payload_base<unsigned_short> local_7bc;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  uint64_t offset_start;
  uint64_t offset_of_referring_table_local;
  undefined1 local_780 [16];
  _Storage<unsigned_short,_true> local_770;
  undefined2 uStack_76e;
  undefined8 local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_758;
  _Alloc_hider local_750;
  undefined4 local_748;
  string referring_table_name;
  undefined1 local_6a8 [8];
  _Alloc_hider local_6a0;
  undefined1 local_698 [24];
  BinaryRegionCommentType local_680;
  _Alloc_hider local_678;
  pointer local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  _Alloc_hider local_658;
  size_type local_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  ulong local_638;
  undefined1 local_630 [8];
  _Alloc_hider local_628;
  undefined1 local_620 [24];
  BinaryRegionCommentType local_608;
  _Alloc_hider local_600;
  pointer local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  _Alloc_hider local_5e0;
  size_type local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  size_t local_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *pcStack_5a0;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_598;
  map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
  fields;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  undefined1 local_488 [8];
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  BinaryRegionCommentType local_460;
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  _Alloc_hider local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  size_t local_418;
  string local_410 [32];
  BinaryRegionComment local_3f0;
  BinaryRegionComment local_378;
  BinaryRegionComment local_300;
  BinaryRegionComment local_288;
  BinaryRegionComment local_210;
  BinaryRegionComment local_198;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  vtable_offset_local = vtable_offset;
  offset_of_referring_table_local = offset_of_referring_table;
  this_01 = (_List_node_base *)
            std::
            map<unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>_>_>_>
            ::operator[](&this->vtables_,&vtable_offset_local);
  for (p_Var9 = this_01->_M_next; p_Var9 != this_01;
      p_Var9 = (((_List_base<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (p_Var9[1]._M_next == (_List_node_base *)table) {
      return (VTable *)(p_Var9 + 1);
    }
  }
  if ((this_01->_M_next == this_01) && (bVar1 = ContainsSection(this,vtable_offset_local), bVar1)) {
    return (VTable *)0x0;
  }
  this_02 = reflection::Object::name(table);
  String::str_abi_cxx11_(&referring_table_name,this_02);
  local_480._M_p = (pointer)&local_470;
  local_488._0_4_ = OK;
  local_478 = 0;
  local_470._M_local_buf[0] = '\0';
  local_458._M_p = (pointer)&local_448;
  local_450 = 0;
  local_448._M_local_buf[0] = '\0';
  local_438._M_p = (pointer)&local_428;
  local_430 = 0;
  local_428._M_local_buf[0] = '\0';
  local_418 = 0;
  local_460 = VTableSize;
  OVar3 = ReadScalar<unsigned_short>(this,vtable_offset_local);
  uVar11 = vtable_offset_local;
  if (((uint)OVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_short> >> 0x10 & 1) == 0) {
    uVar11 = 0;
    if (vtable_offset_local <= this->binary_length_) {
      uVar11 = this->binary_length_ - vtable_offset_local;
    }
    std::__cxx11::string::string<std::allocator<char>>(local_4a8,"2",(allocator<char> *)local_780);
    local_488._0_4_ = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_480);
    std::__cxx11::string::~string(local_4a8);
    uVar12 = vtable_offset_local;
    BinaryRegionComment::BinaryRegionComment(&local_120,(BinaryRegionComment *)local_488);
    anon_unknown_45::MakeBinaryRegion
              ((BinaryRegion *)local_780,uVar12,uVar11,Unknown,uVar11,0,&local_120);
    anon_unknown_45::MakeSingleRegionBinarySection
              ((BinarySection *)local_630,&referring_table_name,VTable,(BinaryRegion *)local_780);
    AddSection(this,uVar12,(BinarySection *)local_630);
    BinarySection::~BinarySection((BinarySection *)local_630);
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
    this_03 = &local_120;
  }
  else {
    vtable_size = OVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_short>._M_payload;
    if ((((uint)OVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_short> & 0xffff) + vtable_offset_local) - 1 <
        this->binary_length_) {
      if (3 < vtable_size) {
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        regions.
        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BinaryRegionComment::BinaryRegionComment(&local_288,(BinaryRegionComment *)local_488);
        local_7c8 = this;
        anon_unknown_45::MakeBinaryRegion((BinaryRegion *)local_780,uVar11,2,Uint16,0,0,&local_288);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
        emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_780);
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
        BinaryRegionComment::~BinaryRegionComment(&local_288);
        uVar12 = vtable_offset_local;
        local_628._M_p = local_620 + 8;
        local_630._0_4_ = OK;
        local_620._0_8_ = 0;
        local_620[8] = '\0';
        local_600._M_p = (pointer)&local_5f0;
        local_5f8 = (pointer)0x0;
        uVar11 = vtable_offset_local + 2;
        local_5f0._M_local_buf[0] = '\0';
        local_5e0._M_p = (pointer)&local_5d0;
        local_5d8 = 0;
        local_5d0._M_local_buf[0] = '\0';
        local_5c0 = 0;
        local_608 = VTableRefferingTableLength;
        _Var4 = (_Optional_payload_base<unsigned_short>)ReadScalar<unsigned_short>(local_7c8,uVar11)
        ;
        this_00 = local_7c8;
        if (((uint)_Var4 >> 0x10 & 1) == 0) {
          uVar12 = 0;
          if (uVar11 <= local_7c8->binary_length_) {
            uVar12 = local_7c8->binary_length_ - uVar11;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    (local_508,"2",(allocator<char> *)local_780);
          local_630._0_4_ = ERROR_INCOMPLETE_BINARY;
          std::__cxx11::string::_M_assign((string *)&local_628);
          std::__cxx11::string::~string(local_508);
          BinaryRegionComment::BinaryRegionComment(&local_300,(BinaryRegionComment *)local_630);
          anon_unknown_45::MakeBinaryRegion
                    ((BinaryRegion *)local_780,uVar11,uVar12,Unknown,uVar12,0,&local_300);
          anon_unknown_45::MakeSingleRegionBinarySection
                    ((BinarySection *)local_6a8,&referring_table_name,VTable,
                     (BinaryRegion *)local_780);
          AddSection(this_00,uVar11,(BinarySection *)local_6a8);
          BinarySection::~BinarySection((BinarySection *)local_6a8);
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
          BinaryRegionComment::~BinaryRegionComment(&local_300);
          pVVar10 = (VTable *)0x0;
        }
        else {
          local_7bc = _Var4;
          if ((offset_of_referring_table_local + ((uint)_Var4 & 0xffff)) - 1 <
              local_7c8->binary_length_) {
            if (_Var4._M_payload._M_value < 4) {
              std::__cxx11::string::string<std::allocator<char>>
                        (local_548,"4",(allocator<char> *)local_780);
              local_630._0_4_ = ERROR_LENGTH_TOO_SHORT;
              std::__cxx11::string::_M_assign((string *)&local_628);
              this_04 = local_548;
              goto LAB_0022e466;
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_528,"",(allocator<char> *)local_780);
            local_630._0_4_ = ERROR_LENGTH_TOO_LONG;
            std::__cxx11::string::_M_assign((string *)&local_628);
            this_04 = local_528;
LAB_0022e466:
            std::__cxx11::string::~string(this_04);
          }
          BinaryRegionComment::BinaryRegionComment(&local_378,(BinaryRegionComment *)local_630);
          anon_unknown_45::MakeBinaryRegion
                    ((BinaryRegion *)local_780,uVar11,2,Uint16,0,0,&local_378);
          std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
          emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_780);
          BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
          BinaryRegionComment::~BinaryRegionComment(&local_378);
          fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &fields._M_t._M_impl.super__Rb_tree_header._M_header;
          fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          offset_start = uVar12 + 4;
          fields_processed = 0;
          local_5b8._M_unused._M_object = (void *)0x0;
          local_5b8._8_8_ = 0;
          local_5a8 = (code *)0x0;
          pcStack_5a0 = (code *)0x0;
          fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_5b8._M_unused._M_object = operator_new(0x40);
          *(uint64_t **)local_5b8._M_unused._0_8_ = &offset_start;
          *(uint64_t **)((long)local_5b8._M_unused._0_8_ + 8) = &vtable_offset_local;
          *(uint16_t **)((long)local_5b8._M_unused._0_8_ + 0x10) = &vtable_size;
          *(BinaryAnnotator **)((long)local_5b8._M_unused._0_8_ + 0x18) = local_7c8;
          *(vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> **)
           ((long)local_5b8._M_unused._0_8_ + 0x20) = &regions;
          *(uint64_t **)((long)local_5b8._M_unused._0_8_ + 0x28) = &offset_of_referring_table_local;
          *(map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
            **)((long)local_5b8._M_unused._0_8_ + 0x30) = &fields;
          *(uint16_t **)((long)local_5b8._M_unused._0_8_ + 0x38) = &fields_processed;
          pcStack_5a0 = std::
                        _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                        ::_M_invoke;
          local_5a8 = std::
                      _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/binary_annotator.cpp:355:42)>
                      ::_M_manager;
          ForAllFields(table,false,(function<void_(const_reflection::Field_*)> *)&local_5b8);
          std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
          uVar8 = (ulong)fields_processed;
          uVar2 = (ushort)(vtable_size + 0x1fffc >> 1);
          if ((ushort)(fields_processed * 3) < uVar2) {
            uVar2 = fields_processed * 3;
          }
          uVar5 = (ulong)((uint)fields_processed * 2);
          for (; uVar8 < uVar2; uVar8 = uVar8 + 1) {
            offset = offset_start + uVar5;
            OVar3 = ReadScalar<unsigned_short>(local_7c8,offset);
            local_6a8._0_4_ = OK;
            local_6a0._M_p = local_698 + 8;
            local_698._0_8_ = 0;
            local_698[8] = '\0';
            local_678._M_p = (pointer)&local_668;
            local_670 = (pointer)0x0;
            local_668._M_local_buf[0] = '\0';
            local_658._M_p = (pointer)&local_648;
            local_650 = 0;
            local_648._M_local_buf[0] = '\0';
            local_680 = VTableUnknownFieldOffset;
            local_638 = uVar8;
            if (((uint)OVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_short> >> 0x10 & 1) == 0) {
              uVar11 = 0;
              if (offset <= local_7c8->binary_length_) {
                uVar11 = local_7c8->binary_length_ - offset;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        (local_410,"2",(allocator<char> *)local_780);
              local_6a8._0_4_ = ERROR_INCOMPLETE_BINARY;
              std::__cxx11::string::_M_assign((string *)&local_6a0);
              std::__cxx11::string::~string(local_410);
              BinaryRegionComment::BinaryRegionComment(&local_3f0,(BinaryRegionComment *)local_6a8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_780,offset,uVar11,Unknown,uVar11,0,&local_3f0);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_780);
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
              BinaryRegionComment::~BinaryRegionComment(&local_3f0);
            }
            else {
              local_780._0_2_ = (short)uVar8;
              local_780._8_8_ = (Field *)0x0;
              local_770._M_value =
                   OVar3.super__Optional_base<unsigned_short,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_short>._M_payload;
              std::
              _Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
              ::
              _M_emplace_unique<std::pair<unsigned_short,flatbuffers::BinaryAnnotator::VTable::Entry>>
                        ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>,std::_Select1st<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,flatbuffers::BinaryAnnotator::VTable::Entry>>>
                          *)&fields,
                         (pair<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry> *)
                         local_780);
              BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_6a8);
              anon_unknown_45::MakeBinaryRegion
                        ((BinaryRegion *)local_780,offset,2,VOffset,0,0,&local_a8);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              emplace_back<flatbuffers::BinaryRegion>(&regions,(BinaryRegion *)local_780);
              BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
              BinaryRegionComment::~BinaryRegionComment(&local_a8);
            }
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_6a8);
            uVar5 = uVar5 + 2;
          }
          if (this_01->_M_next == this_01) {
            local_598.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 regions.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_598.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 regions.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_598.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 regions.
                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            regions.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            regions.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            regions.
            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            anon_unknown_45::MakeBinarySection
                      ((BinarySection *)local_780,&referring_table_name,VTable,&local_598);
            pmVar6 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&local_7c8->sections_,&vtable_offset_local);
            BinarySection::operator=(pmVar6,(BinarySection *)local_780);
            BinarySection::~BinarySection((BinarySection *)local_780);
            std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            ~vector(&local_598);
            _Var7 = local_7bc._M_payload;
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_780,", ",&referring_table_name);
            _Var7 = local_7bc._M_payload;
            pmVar6 = std::
                     map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
                     ::operator[](&local_7c8->sections_,&vtable_offset_local);
            std::__cxx11::string::append((string *)pmVar6);
            std::__cxx11::string::~string((string *)local_780);
          }
          local_760 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_770;
          _local_770 = Unknown;
          local_768 = 0;
          local_750._M_p = (pointer)0x0;
          local_748._0_2_ = 0;
          local_748._2_2_ = 0;
          local_780._0_8_ = table;
          local_758 = local_760;
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::operator=((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)(local_780 + 8),&fields._M_t);
          local_748._2_2_ = _Var7._M_value;
          local_748._0_2_ = vtable_size;
          std::__cxx11::
          list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
          ::push_back((list<flatbuffers::BinaryAnnotator::VTable,_std::allocator<flatbuffers::BinaryAnnotator::VTable>_>
                       *)this_01,(value_type *)local_780);
          pVVar10 = (VTable *)(this_01->_M_prev + 1);
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
                       *)(local_780 + 8));
          std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>,_std::_Select1st<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          ::~_Rb_tree(&fields._M_t);
        }
        BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_630);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&regions);
        goto LAB_0022e1cd;
      }
      std::__cxx11::string::string<std::allocator<char>>(local_4e8,"4",(allocator<char> *)local_780)
      ;
      local_488._0_4_ = ERROR_LENGTH_TOO_SHORT;
      std::__cxx11::string::_M_assign((string *)&local_480);
      std::__cxx11::string::~string(local_4e8);
      uVar11 = vtable_offset_local;
      BinaryRegionComment::BinaryRegionComment(&local_210,(BinaryRegionComment *)local_488);
      anon_unknown_45::MakeBinaryRegion((BinaryRegion *)local_780,uVar11,2,Uint16,0,0,&local_210);
      anon_unknown_45::MakeSingleRegionBinarySection
                ((BinarySection *)local_630,&referring_table_name,VTable,(BinaryRegion *)local_780);
      AddSection(this,uVar11,(BinarySection *)local_630);
      BinarySection::~BinarySection((BinarySection *)local_630);
      BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
      this_03 = &local_210;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_4c8,"",(allocator<char> *)local_780);
      local_488._0_4_ = ERROR_LENGTH_TOO_LONG;
      std::__cxx11::string::_M_assign((string *)&local_480);
      std::__cxx11::string::~string(local_4c8);
      uVar11 = vtable_offset_local;
      BinaryRegionComment::BinaryRegionComment(&local_198,(BinaryRegionComment *)local_488);
      anon_unknown_45::MakeBinaryRegion((BinaryRegion *)local_780,uVar11,2,Uint16,0,0,&local_198);
      anon_unknown_45::MakeSingleRegionBinarySection
                ((BinarySection *)local_630,&referring_table_name,VTable,(BinaryRegion *)local_780);
      AddSection(this,uVar11,(BinarySection *)local_630);
      BinarySection::~BinarySection((BinarySection *)local_630);
      BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)&local_758);
      this_03 = &local_198;
    }
  }
  BinaryRegionComment::~BinaryRegionComment(this_03);
  pVVar10 = (VTable *)0x0;
LAB_0022e1cd:
  BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_488);
  std::__cxx11::string::~string((string *)&referring_table_name);
  return pVVar10;
}

Assistant:

BinaryAnnotator::VTable *BinaryAnnotator::GetOrBuildVTable(
    const uint64_t vtable_offset, const reflection::Object *const table,
    const uint64_t offset_of_referring_table) {
  // Get a list of vtables (if any) already defined at this offset.
  std::list<VTable> &vtables = vtables_[vtable_offset];

  // See if this vtable for the table type has been generated before.
  for (VTable &vtable : vtables) {
    if (vtable.referring_table == table) { return &vtable; }
  }

  // If we are trying to make a new vtable and it is already encompassed by
  // another binary section, something is corrupted.
  if (vtables.empty() && ContainsSection(vtable_offset)) { return nullptr; }

  const std::string referring_table_name = table->name()->str();

  BinaryRegionComment vtable_size_comment;
  vtable_size_comment.type = BinaryRegionCommentType::VTableSize;

  const auto vtable_length = ReadScalar<uint16_t>(vtable_offset);
  if (!vtable_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vtable_offset);

    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, remaining,
                                    BinaryRegionType::Unknown, remaining, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  // Vtables start with the size of the vtable
  const uint16_t vtable_size = vtable_length.value();

  if (!IsValidOffset(vtable_offset + vtable_size - 1)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    // The vtable_size points to off the end of the binary.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));

    return nullptr;
  } else if (vtable_size < 2 * sizeof(uint16_t)) {
    SetError(vtable_size_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
    // The size includes itself and the table size which are both uint16_t.
    AddSection(vtable_offset,
               MakeSingleRegionBinarySection(
                   referring_table_name, BinarySectionType::VTable,
                   MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                    BinaryRegionType::Uint16, 0, 0,
                                    vtable_size_comment)));
    return nullptr;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vtable_offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     vtable_size_comment));
  uint64_t offset = vtable_offset + sizeof(uint16_t);

  BinaryRegionComment ref_table_len_comment;
  ref_table_len_comment.type =
      BinaryRegionCommentType::VTableRefferingTableLength;

  // Ensure we can read the next uint16_t field, which is the size of the
  // referring table.
  const auto table_length = ReadScalar<uint16_t>(offset);

  if (!table_length.has_value()) {
    const uint64_t remaining = RemainingBytes(offset);
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "2");

    AddSection(offset, MakeSingleRegionBinarySection(
                           referring_table_name, BinarySectionType::VTable,
                           MakeBinaryRegion(
                               offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, ref_table_len_comment)));
    return nullptr;
  }

  // Then they have the size of the table they reference.
  const uint16_t table_size = table_length.value();

  if (!IsValidOffset(offset_of_referring_table + table_size - 1)) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
  } else if (table_size < 4) {
    SetError(ref_table_len_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_SHORT,
             "4");
  }

  regions.push_back(MakeBinaryRegion(offset, sizeof(uint16_t),
                                     BinaryRegionType::Uint16, 0, 0,
                                     ref_table_len_comment));
  offset += sizeof(uint16_t);

  const uint64_t offset_start = offset;

  // A mapping between field (and its id) to the relative offset (uin16_t) from
  // the start of the table.
  std::map<uint16_t, VTable::Entry> fields;

  // Counter for determining if the binary has more vtable entries than the
  // schema provided. This can occur if the binary was created at a newer schema
  // version and is being processed with an older one.
  uint16_t fields_processed = 0;

  // Loop over all the fields.
  ForAllFields(table, /*reverse=*/false, [&](const reflection::Field *field) {
    const uint64_t field_offset = offset_start + field->id() * sizeof(uint16_t);

    if (field_offset >= vtable_offset + vtable_size) {
      // This field_offset is too large for this vtable, so it must come from a
      // newer schema than the binary was create with or the binary writer did
      // not write it. For either case, it is safe to ignore.

      // TODO(dbaileychess): We could show which fields are not set an their
      // default values if we want. We just need a way to make it obvious that
      // it isn't part of the buffer.
      return;
    }

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableFieldOffset;
    field_comment.name = std::string(field->name()->c_str()) +
                         "` (id: " + std::to_string(field->id()) + ")";

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);

      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));

      return;
    }

    if (!IsValidOffset(offset_of_referring_table + offset_from_table.value() -
                       1)) {
      SetError(field_comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
      regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                         BinaryRegionType::VOffset, 0, 0,
                                         field_comment));
      return;
    }

    VTable::Entry entry;
    entry.field = field;
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(field->id(), entry));

    std::string default_label;
    if (offset_from_table.value() == 0) {
      // Not present, so could be default or be optional.
      if (field->required()) {
        SetError(field_comment,
                 BinaryRegionStatus::ERROR_REQUIRED_FIELD_NOT_PRESENT);
        // If this is a required field, make it known this is an error.
        regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                           BinaryRegionType::VOffset, 0, 0,
                                           field_comment));
        return;
      } else {
        // Its an optional field, so get the default value and interpret and
        // provided an annotation for it.
        if (IsScalar(field->type()->base_type())) {
          default_label += "<defaults to ";
          default_label += IsFloat(field->type()->base_type())
                               ? std::to_string(field->default_real())
                               : std::to_string(field->default_integer());
          default_label += "> (";
        } else {
          default_label += "<null> (";
        }
        default_label +=
            reflection::EnumNameBaseType(field->type()->base_type());
        default_label += ")";
      }
    }
    field_comment.default_value = default_label;

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));

    fields_processed++;
  });

  // Check if we covered all the expectant fields. If not, we need to add them
  // as unknown fields.
  uint16_t expectant_vtable_fields =
      (vtable_size - sizeof(uint16_t) - sizeof(uint16_t)) / sizeof(uint16_t);

  // Prevent a bad binary from declaring a really large vtable_size, that we can
  // not independently verify.
  expectant_vtable_fields = std::min(
      static_cast<uint16_t>(fields_processed * 3), expectant_vtable_fields);

  for (uint16_t id = fields_processed; id < expectant_vtable_fields; ++id) {
    const uint64_t field_offset = offset_start + id * sizeof(uint16_t);

    const auto offset_from_table = ReadScalar<uint16_t>(field_offset);

    BinaryRegionComment field_comment;
    field_comment.type = BinaryRegionCommentType::VTableUnknownFieldOffset;
    field_comment.index = id;

    if (!offset_from_table.has_value()) {
      const uint64_t remaining = RemainingBytes(field_offset);
      SetError(field_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");
      regions.push_back(MakeBinaryRegion(field_offset, remaining,
                                         BinaryRegionType::Unknown, remaining,
                                         0, field_comment));
      continue;
    }

    VTable::Entry entry;
    entry.field = nullptr;  // No field to reference.
    entry.offset_from_table = offset_from_table.value();
    fields.insert(std::make_pair(id, entry));

    regions.push_back(MakeBinaryRegion(field_offset, sizeof(uint16_t),
                                       BinaryRegionType::VOffset, 0, 0,
                                       field_comment));
  }

  // If we have never added this vtable before record the Binary section.
  if (vtables.empty()) {
    sections_[vtable_offset] = MakeBinarySection(
        referring_table_name, BinarySectionType::VTable, std::move(regions));
  } else {
    // Add the current table name to the name of the section.
    sections_[vtable_offset].name += ", " + referring_table_name;
  }

  VTable vtable;
  vtable.referring_table = table;
  vtable.fields = std::move(fields);
  vtable.table_size = table_size;
  vtable.vtable_size = vtable_size;

  // Add this vtable to the collection of vtables at this offset.
  vtables.push_back(std::move(vtable));

  // Return the vtable we just added.
  return &vtables.back();
}